

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

ALLEGRO_PATH * al_get_standard_path(int id)

{
  int in_EDI;
  ALLEGRO_PATH *exe_dir;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  ALLEGRO_PATH *local_8;
  
  if ((in_EDI == 6) && (active_sysdrv->user_exe_path != (ALLEGRO_PATH *)0x0)) {
    local_8 = al_clone_path((ALLEGRO_PATH *)CONCAT44(id,in_stack_00000008));
  }
  else if ((in_EDI == 0) && (active_sysdrv->user_exe_path != (ALLEGRO_PATH *)0x0)) {
    local_8 = al_clone_path((ALLEGRO_PATH *)CONCAT44(id,in_stack_00000008));
    al_set_path_filename((ALLEGRO_PATH *)CONCAT44(in_EDI,in_stack_fffffffffffffff0),(char *)local_8)
    ;
  }
  else if (active_sysdrv->vt->get_path == (_func_ALLEGRO_PATH_ptr_int *)0x0) {
    local_8 = (ALLEGRO_PATH *)0x0;
  }
  else {
    local_8 = (*active_sysdrv->vt->get_path)(in_EDI);
  }
  return local_8;
}

Assistant:

ALLEGRO_PATH *al_get_standard_path(int id)
{
   ASSERT(active_sysdrv);
   ASSERT(active_sysdrv->vt);
   ASSERT(active_sysdrv->vt->get_path);
   
   if (id == ALLEGRO_EXENAME_PATH && active_sysdrv->user_exe_path)
      return al_clone_path(active_sysdrv->user_exe_path);
   
   if (id == ALLEGRO_RESOURCES_PATH && active_sysdrv->user_exe_path) {
      ALLEGRO_PATH *exe_dir = al_clone_path(active_sysdrv->user_exe_path);
      al_set_path_filename(exe_dir, NULL);
      return exe_dir;
   }

   if (active_sysdrv->vt->get_path)
      return active_sysdrv->vt->get_path(id);

   return NULL;
}